

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnBrTableExpr
          (BinaryReaderIR *this,Index num_targets,Index *target_depths,Index default_target_depth)

{
  Index IVar1;
  Result RVar2;
  pointer pBVar3;
  reference this_00;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_120;
  Location local_118;
  Var local_f8;
  uint local_b0;
  Index i;
  Location local_a0;
  Var local_80;
  unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> local_38;
  unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> expr;
  Index default_target_depth_local;
  Index *target_depths_local;
  Index num_targets_local;
  BinaryReaderIR *this_local;
  
  expr._M_t.super___uniq_ptr_impl<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::BrTableExpr_*,_std::default_delete<wabt::BrTableExpr>_>.
  super__Head_base<0UL,_wabt::BrTableExpr_*,_false>._M_head_impl._4_4_ = default_target_depth;
  MakeUnique<wabt::BrTableExpr>();
  IVar1 = expr._M_t.
          super___uniq_ptr_impl<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>._M_t.
          super__Tuple_impl<0UL,_wabt::BrTableExpr_*,_std::default_delete<wabt::BrTableExpr>_>.
          super__Head_base<0UL,_wabt::BrTableExpr_*,_false>._M_head_impl._4_4_;
  Location::Location(&local_a0);
  Var::Var(&local_80,IVar1,&local_a0);
  pBVar3 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::operator->
                     (&local_38);
  Var::operator=(&pBVar3->default_target,&local_80);
  Var::~Var(&local_80);
  pBVar3 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::operator->
                     (&local_38);
  std::vector<wabt::Var,_std::allocator<wabt::Var>_>::resize(&pBVar3->targets,(ulong)num_targets);
  for (local_b0 = 0; local_b0 < num_targets; local_b0 = local_b0 + 1) {
    IVar1 = target_depths[local_b0];
    Location::Location(&local_118);
    Var::Var(&local_f8,IVar1,&local_118);
    pBVar3 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::operator->
                       (&local_38);
    this_00 = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::operator[]
                        (&pBVar3->targets,(ulong)local_b0);
    Var::operator=(this_00,&local_f8);
    Var::~Var(&local_f8);
  }
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::BrTableExpr,std::default_delete<wabt::BrTableExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_120,&local_38);
  RVar2 = AppendExpr(this,&local_120);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_120);
  std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::~unique_ptr
            (&local_38);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnBrTableExpr(Index num_targets,
                                     Index* target_depths,
                                     Index default_target_depth) {
  auto expr = MakeUnique<BrTableExpr>();
  expr->default_target = Var(default_target_depth);
  expr->targets.resize(num_targets);
  for (Index i = 0; i < num_targets; ++i) {
    expr->targets[i] = Var(target_depths[i]);
  }
  return AppendExpr(std::move(expr));
}